

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_test_util.cc
# Opt level: O3

Template * ctemplate::StringToTemplate(string *s,Strip strip)

{
  Template *pTVar1;
  string local_50;
  TemplateString local_30;
  
  StringToTemplateFile(&local_50,s);
  local_30.ptr_ = local_50._M_dataplus._M_p;
  local_30.length_ = local_50._M_string_length;
  local_30.is_immutable_ = false;
  local_30.id_ = 0;
  pTVar1 = (Template *)ctemplate::Template::GetTemplate(&local_30,strip);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return pTVar1;
}

Assistant:

Template* StringToTemplate(const string& s, Strip strip) {
  return Template::GetTemplate(StringToTemplateFile(s), strip);
}